

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
          (SourceLocationCommentPrinter *this,string *output)

{
  string local_30;
  
  if ((this->have_source_loc_ == true) &&
     ((this->source_loc_).trailing_comments._M_string_length != 0)) {
    FormatComment(&local_30,this,&(this->source_loc_).trailing_comments);
    std::__cxx11::string::_M_append((char *)output,(ulong)local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void AddPostComment(std::string* output) {
    if (have_source_loc_ && source_loc_.trailing_comments.size() > 0) {
      *output += FormatComment(source_loc_.trailing_comments);
    }
  }